

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall cmExtraCodeBlocksGenerator::Generate(cmExtraCodeBlocksGenerator *this)

{
  cmGlobalGenerator *pcVar1;
  _Rb_tree_node_base *p_Var2;
  
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  for (p_Var2 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    CreateProjectFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                           (p_Var2 + 2));
  }
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::Generate()
{
  // for each sub project in the project create a codeblocks project
  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    // create a project file
    this->CreateProjectFile(it.second);
  }
}